

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

void __thiscall PClass::InsertIntoHash(PClass *this)

{
  PTypeBase *pPVar1;
  PClass *pPVar2;
  int iVar3;
  PType *pPVar4;
  char *pcVar5;
  PType *found;
  size_t bucket;
  PClass *this_local;
  
  pPVar2 = RegistrationInfo.MyClass;
  pPVar1 = (this->super_PNativeStruct).super_PStruct.super_PNamedType.Outer;
  bucket = (size_t)this;
  iVar3 = FName::operator_cast_to_int
                    (&(this->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName);
  pPVar4 = FTypeTable::FindType(&TypeTable,pPVar2,(intptr_t)pPVar1,(long)iVar3,(size_t *)&found);
  pPVar2 = RegistrationInfo.MyClass;
  if (pPVar4 == (PType *)0x0) {
    pPVar1 = (this->super_PNativeStruct).super_PStruct.super_PNamedType.Outer;
    iVar3 = FName::operator_cast_to_int
                      (&(this->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName);
    FTypeTable::AddType(&TypeTable,(PType *)this,pPVar2,(intptr_t)pPVar1,(long)iVar3,(size_t)found);
  }
  else {
    pcVar5 = FName::GetChars(&(this->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName);
    I_Error("Tried to register class \'%s\' more than once.\n",pcVar5);
  }
  return;
}

Assistant:

void PClass::InsertIntoHash ()
{
	size_t bucket;
	PType *found;

	found = TypeTable.FindType(RUNTIME_CLASS(PClass), (intptr_t)Outer, TypeName, &bucket);
	if (found != NULL)
	{ // This type has already been inserted
		I_Error("Tried to register class '%s' more than once.\n", TypeName.GetChars());
	}
	else
	{
		TypeTable.AddType(this, RUNTIME_CLASS(PClass), (intptr_t)Outer, TypeName, bucket);
	}
}